

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O1

Var Js::JavascriptDate::EntryToJSON(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this;
  code *pcVar3;
  CallInfo CVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  Attributes attributes;
  undefined4 *puVar8;
  Var pvVar9;
  RecyclableObject *pRVar10;
  JavascriptMethod p_Var11;
  PropertyRecord *pPVar12;
  ScriptContext *scriptContext;
  int in_stack_00000010;
  undefined1 local_60 [8];
  ArgumentReader args;
  Var result;
  CallInfo callInfo_local;
  RecyclableObject *thisObj;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (Var)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)result) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4fc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00bc924d;
    *puVar8 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_60 = (undefined1  [8])result;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_60,(CallInfo *)&result);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)result & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4ff,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) {
LAB_00bc924d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  if (((ulong)local_60 & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec41,L"Data.prototype.toJSON");
  }
  callInfo_local = (CallInfo)0x0;
  pvVar9 = Arguments::operator[]((Arguments *)local_60,0);
  scriptContext = pSVar2;
  BVar7 = JavascriptConversion::ToObject(pvVar9,pSVar2,(RecyclableObject **)&callInfo_local);
  if (BVar7 == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec42,L"Date.prototype.toJSON");
  }
  args.super_Arguments.Values = (Type)0x0;
  BVar7 = TryInvokeRemotely(EntryToJSON,scriptContext,(Arguments *)local_60,
                            &args.super_Arguments.Values);
  if (BVar7 != 0) {
    return args.super_Arguments.Values;
  }
  pvVar9 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>((Var)callInfo_local,pSVar2);
  if (((ulong)pvVar9 >> 0x32 != 0) &&
     (bVar5 = NumberUtilities::IsFinite((double)((ulong)pvVar9 ^ 0xfffc000000000000)), !bVar5)) {
    return (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           nullValue.ptr;
  }
  pvVar9 = JavascriptOperators::GetProperty
                     ((RecyclableObject *)callInfo_local,0x16e,pSVar2,(PropertyValueInfo *)0x0);
  bVar5 = JavascriptConversion::IsCallable(pvVar9);
  if (!bVar5) {
    pPVar12 = ScriptContext::GetPropertyName(pSVar2,0x16e);
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec45,(PCWSTR)(pPVar12 + 1));
  }
  pRVar10 = VarTo<Js::RecyclableObject>(pvVar9);
  CVar4 = callInfo_local;
  this = pSVar2->threadContext;
  bVar5 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(pRVar10);
  bVar6 = ThreadContext::HasNoSideEffect(this,pRVar10,attributes);
  if (bVar6) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
    if (pSVar2->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar10);
    CheckIsExecutable(pRVar10,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar10);
    pRVar10 = (RecyclableObject *)(*p_Var11)(pRVar10,(CallInfo)pRVar10,1,0,0,0,0,1,CVar4);
    bVar6 = ThreadContext::IsOnStack(pRVar10);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar10 = (((((((((pRVar10->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                    scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00bc91bf;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
      if (pSVar2->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var11 = RecyclableObject::GetEntryPoint(pRVar10);
      CheckIsExecutable(pRVar10,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint(pRVar10);
      pRVar10 = (RecyclableObject *)(*p_Var11)(pRVar10,(CallInfo)pRVar10,1,0,0,0,0,1,CVar4);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00bc91bf;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
    if (pSVar2->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar10);
    CheckIsExecutable(pRVar10,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar10);
    pRVar10 = (RecyclableObject *)(*p_Var11)(pRVar10,(CallInfo)pRVar10,1,0,0,0,0,1,CVar4);
    bVar6 = ThreadContext::IsOnStack(pRVar10);
  }
  if (bVar6 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00bc91bf:
  this->reentrancySafeOrHandled = bVar5;
  return pRVar10;
}

Assistant:

Var JavascriptDate::EntryToJSON(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Data.prototype.toJSON"));
        }
        RecyclableObject* thisObj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Date.prototype.toJSON"));
        }

        Var result = nullptr;
        if (TryInvokeRemotely(EntryToJSON, scriptContext, args, &result))
        {
            return result;
        }

        Var num = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(thisObj, scriptContext);
        if (JavascriptNumber::Is(num)
            && !NumberUtilities::IsFinite(JavascriptNumber::GetValue(num)))
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        Var toISO = JavascriptOperators::GetProperty(thisObj, PropertyIds::toISOString, scriptContext, NULL);
        if (!JavascriptConversion::IsCallable(toISO))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toISOString)->GetBuffer());
        }
        RecyclableObject* toISOFunc = VarTo<RecyclableObject>(toISO);
        return scriptContext->GetThreadContext()->ExecuteImplicitCall(toISOFunc, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), toISOFunc, CallInfo(1), thisObj);
        });
    }